

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_kptr_(jit_State *J,IROp op,void *ptr)

{
  ushort uVar1;
  undefined4 *puVar2;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  uint in_ESI;
  long in_RDI;
  IRRef ref;
  IRIns *cir;
  IRIns *ir;
  IRRef ref_1;
  uint local_3c;
  jit_State *J_00;
  
  J_00 = (jit_State *)CONCAT62(in_register_00000012,in_DX);
  uVar1 = *(ushort *)(in_RDI + 0x140 + (ulong)in_ESI * 2);
  while (local_3c = (uint)uVar1, local_3c != 0) {
    if ((jit_State *)(ulong)*(uint *)(*(long *)(in_RDI + 0x10) + (ulong)local_3c * 8) == J_00)
    goto LAB_00145bdd;
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x10) + 6 + (ulong)local_3c * 8);
  }
  local_3c = *(uint *)(in_RDI + 0x18);
  if (local_3c <= *(uint *)(in_RDI + 0x10c)) {
    lj_ir_growbot(J_00);
  }
  local_3c = local_3c - 1;
  *(uint *)(in_RDI + 0x18) = local_3c;
  puVar2 = (undefined4 *)(*(long *)(in_RDI + 0x10) + (ulong)local_3c * 8);
  *puVar2 = (int)J_00;
  *(undefined1 *)(puVar2 + 1) = 5;
  *(char *)((long)puVar2 + 5) = (char)in_ESI;
  *(undefined2 *)((long)puVar2 + 6) = *(undefined2 *)(in_RDI + 0x140 + (ulong)in_ESI * 2);
  *(short *)(in_RDI + 0x140 + (ulong)in_ESI * 2) = (short)local_3c;
LAB_00145bdd:
  return local_3c + 0x5000000;
}

Assistant:

TRef lj_ir_kptr_(jit_State *J, IROp op, void *ptr)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  lua_assert((void *)(intptr_t)i32ptr(ptr) == ptr);
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (mref(cir[ref].ptr, void) == ptr)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  setmref(ir->ptr, ptr);
  ir->t.irt = IRT_P32;
  ir->o = op;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, IRT_P32);
}